

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void musig_tweak_test_helper
               (secp256k1_xonly_pubkey *agg_pk,uchar *sk0,uchar *sk1,
               secp256k1_musig_keyagg_cache *keyagg_cache)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  secp256k1_pubkey *pubkey;
  secp256k1_musig_session *secnonce_00;
  secp256k1_musig_session *session_00;
  secp256k1_musig_session *partial_sig_00;
  secp256k1_context *secnonce_01;
  secp256k1_pubkey *pubkey_00;
  secp256k1_musig_partial_sig *partial_sig_ptr [2];
  secp256k1_musig_pubnonce *pubnonce_ptr [2];
  uchar msg [32];
  secp256k1_musig_partial_sig partial_sig [2];
  uchar session_secrand [2] [32];
  secp256k1_musig_session session;
  secp256k1_pubkey pk [2];
  uchar final_sig [64];
  secp256k1_keypair keypair [2];
  secp256k1_musig_pubnonce pubnonce [2];
  secp256k1_musig_secnonce secnonce [2];
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_scalar sStackY_6b0;
  secp256k1_scalar sStackY_690;
  secp256k1_ge sStackY_668;
  secp256k1_musig_session *psStackY_600;
  secp256k1_musig_keyagg_cache *psStackY_5f8;
  secp256k1_pubkey *psStackY_5f0;
  secp256k1_musig_partial_sig *local_5b8;
  undefined1 *local_5b0;
  secp256k1_musig_pubnonce *local_5a8;
  secp256k1_musig_pubnonce *local_5a0;
  uchar local_598 [32];
  undefined1 local_578 [80];
  uchar local_528 [32];
  uchar local_508 [43];
  secp256k1_musig_session local_4dd;
  secp256k1_pubkey local_458;
  secp256k1_pubkey local_418;
  undefined1 local_3d8 [64];
  undefined1 local_398 [96];
  undefined1 local_338 [228];
  secp256k1_musig_pubnonce local_254;
  undefined1 local_1c8 [276];
  secp256k1_musig_aggnonce local_b4;
  
  local_5a8 = (secp256k1_musig_pubnonce *)(local_338 + 0x60);
  local_5b8 = (secp256k1_musig_partial_sig *)local_578;
  psStackY_5f0 = (secp256k1_pubkey *)0x15e8b2;
  testrand256(local_528);
  local_5a0 = &local_254;
  local_5b0 = local_578 + 0x24;
  psStackY_5f0 = (secp256k1_pubkey *)0x15e8d9;
  testrand256(local_508);
  session_00 = (secp256k1_musig_session *)local_1c8;
  psStackY_5f0 = (secp256k1_pubkey *)0x15e8f3;
  uVar1 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session_00,sk0);
  pubkey_00 = (secp256k1_pubkey *)(ulong)uVar1;
  psStackY_5f0 = (secp256k1_pubkey *)0x15e90d;
  uVar2 = secp256k1_keypair_pub(CTX,&local_458,(secp256k1_keypair *)session_00);
  secnonce_01 = (secp256k1_context *)local_398;
  psStackY_5f0 = (secp256k1_pubkey *)0x15e925;
  memcpy(secnonce_01,session_00,0x60);
  if ((uVar2 & uVar1) == 0) {
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebb7;
    musig_tweak_test_helper_cold_12();
LAB_0015ebb7:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebbc;
    musig_tweak_test_helper_cold_11();
LAB_0015ebbc:
    secnonce_00 = (secp256k1_musig_session *)local_1c8;
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebc1;
    musig_tweak_test_helper_cold_1();
LAB_0015ebc1:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebc6;
    musig_tweak_test_helper_cold_2();
LAB_0015ebc6:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebcb;
    musig_tweak_test_helper_cold_10();
LAB_0015ebcb:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebd0;
    musig_tweak_test_helper_cold_9();
LAB_0015ebd0:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebd5;
    musig_tweak_test_helper_cold_8();
LAB_0015ebd5:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebda;
    musig_tweak_test_helper_cold_7();
LAB_0015ebda:
    partial_sig_00 = session_00;
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebdf;
    musig_tweak_test_helper_cold_3();
LAB_0015ebdf:
    psStackY_5f0 = (secp256k1_pubkey *)0x15ebe4;
    musig_tweak_test_helper_cold_4();
  }
  else {
    secnonce_01 = (secp256k1_context *)local_338;
    session_00 = (secp256k1_musig_session *)local_1c8;
    psStackY_5f0 = (secp256k1_pubkey *)0x15e95d;
    uVar1 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session_00,sk1);
    psStackY_5f0 = (secp256k1_pubkey *)0x15e972;
    uVar2 = secp256k1_keypair_pub(CTX,&local_418,(secp256k1_keypair *)session_00);
    pubkey_00 = (secp256k1_pubkey *)(ulong)uVar2;
    psStackY_5f0 = (secp256k1_pubkey *)0x15e985;
    memcpy(secnonce_01,session_00,0x60);
    if ((uVar2 & uVar1) == 0) goto LAB_0015ebb7;
    psStackY_5f0 = (secp256k1_pubkey *)0x15e998;
    testrand256(local_598);
    session_00 = (secp256k1_musig_session *)local_1c8;
    psStackY_5f0 = (secp256k1_pubkey *)0x15e9dd;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)session_00,
                       (secp256k1_musig_pubnonce *)(local_338 + 0x60),local_528,sk0,&local_458,
                       (uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar3 != 1) goto LAB_0015ebbc;
    secnonce_00 = (secp256k1_musig_session *)(local_1c8 + 0x84);
    pubkey_00 = &local_418;
    psStackY_5f0 = (secp256k1_pubkey *)0x15ea2b;
    session_00 = secnonce_00;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)secnonce_00,&local_254,local_508,sk1,
                       pubkey_00,(uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar3 != 1) goto LAB_0015ebc1;
    session_00 = (secp256k1_musig_session *)&local_b4;
    psStackY_5f0 = (secp256k1_pubkey *)0x15ea52;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_nonce_agg(CTX,(secp256k1_musig_aggnonce *)session_00,&local_5a8,2);
    if (iVar3 == 0) goto LAB_0015ebc6;
    session_00 = &local_4dd;
    psStackY_5f0 = (secp256k1_pubkey *)0x15ea7e;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_nonce_process(CTX,session_00,&local_b4,local_598,keyagg_cache);
    if (iVar3 == 0) goto LAB_0015ebcb;
    session_00 = (secp256k1_musig_session *)local_578;
    psStackY_5f0 = (secp256k1_pubkey *)0x15eab2;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)session_00,
                       (secp256k1_musig_secnonce *)local_1c8,(secp256k1_keypair *)local_398,
                       keyagg_cache,&local_4dd);
    if (iVar3 == 0) goto LAB_0015ebd0;
    partial_sig_00 = (secp256k1_musig_session *)(local_578 + 0x24);
    psStackY_5f0 = (secp256k1_pubkey *)0x15eae7;
    session_00 = partial_sig_00;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig_00,
                       (secp256k1_musig_secnonce *)secnonce_00,(secp256k1_keypair *)local_338,
                       keyagg_cache,&local_4dd);
    if (iVar3 == 0) goto LAB_0015ebd5;
    session_00 = (secp256k1_musig_session *)local_578;
    psStackY_5f0 = (secp256k1_pubkey *)0x15eb1b;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)session_00,
                       (secp256k1_musig_pubnonce *)(local_338 + 0x60),&local_458,keyagg_cache,
                       &local_4dd);
    if (iVar3 != 1) goto LAB_0015ebda;
    psStackY_5f0 = (secp256k1_pubkey *)0x15eb44;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig_00,&local_254,pubkey_00,
                       keyagg_cache,&local_4dd);
    if (iVar3 != 1) goto LAB_0015ebdf;
    partial_sig_00 = (secp256k1_musig_session *)local_3d8;
    psStackY_5f0 = (secp256k1_pubkey *)0x15eb74;
    secnonce_01 = CTX;
    iVar3 = secp256k1_musig_partial_sig_agg(CTX,(uchar *)partial_sig_00,&local_4dd,&local_5b8,2);
    if (iVar3 == 1) {
      partial_sig_00 = (secp256k1_musig_session *)local_3d8;
      psStackY_5f0 = (secp256k1_pubkey *)0x15eb9c;
      secnonce_01 = CTX;
      iVar3 = secp256k1_schnorrsig_verify(CTX,(uchar *)partial_sig_00,local_598,0x20,agg_pk);
      if (iVar3 != 0) {
        return;
      }
      goto LAB_0015ebe9;
    }
  }
  psStackY_5f0 = (secp256k1_pubkey *)0x15ebe9;
  musig_tweak_test_helper_cold_5();
LAB_0015ebe9:
  psStackY_5f0 = (secp256k1_pubkey *)musig_test_set_secnonce;
  musig_tweak_test_helper_cold_6();
  psStackY_600 = secnonce_00;
  psStackY_5f8 = keyagg_cache;
  psStackY_5f0 = pubkey_00;
  secp256k1_scalar_set_b32(&sStackY_6b0,partial_sig_00->data,(int *)0x0);
  secp256k1_scalar_set_b32(&sStackY_690,partial_sig_00->data + 0x20,(int *)0x0);
  iVar3 = secp256k1_pubkey_load(CTX,&sStackY_668,pubkey);
  if (iVar3 != 0) {
    secp256k1_musig_secnonce_save((secp256k1_musig_secnonce *)secnonce_01,&sStackY_6b0,&sStackY_668)
    ;
    return;
  }
  musig_test_set_secnonce_cold_1();
  return;
}

Assistant:

static void musig_tweak_test_helper(const secp256k1_xonly_pubkey* agg_pk, const unsigned char *sk0, const unsigned char *sk1, secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_pubkey pk[2];
    unsigned char session_secrand[2][32];
    unsigned char msg[32];
    secp256k1_musig_secnonce secnonce[2];
    secp256k1_musig_pubnonce pubnonce[2];
    const secp256k1_musig_pubnonce *pubnonce_ptr[2];
    secp256k1_musig_aggnonce aggnonce;
    secp256k1_keypair keypair[2];
    secp256k1_musig_session session;
    secp256k1_musig_partial_sig partial_sig[2];
    const secp256k1_musig_partial_sig *partial_sig_ptr[2];
    unsigned char final_sig[64];
    int i;

    for (i = 0; i < 2; i++) {
        pubnonce_ptr[i] = &pubnonce[i];
        partial_sig_ptr[i] = &partial_sig[i];

        testrand256(session_secrand[i]);
    }
    CHECK(create_keypair_and_pk(&keypair[0], &pk[0], sk0) == 1);
    CHECK(create_keypair_and_pk(&keypair[1], &pk[1], sk1) == 1);
    testrand256(msg);

    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[0], &pubnonce[0], session_secrand[0], sk0, &pk[0], NULL, NULL, NULL) == 1);
    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[1], &pubnonce[1], session_secrand[1], sk1, &pk[1], NULL, NULL, NULL) == 1);

    CHECK(secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2) == 1);
    CHECK(secp256k1_musig_nonce_process(CTX, &session, &aggnonce, msg, keyagg_cache) == 1);

    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[0], &secnonce[0], &keypair[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[1], &secnonce[1], &keypair[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[0], &pubnonce[0], &pk[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[1], &pubnonce[1], &pk[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_agg(CTX, final_sig, &session, partial_sig_ptr, 2) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, final_sig, msg, sizeof(msg), agg_pk) == 1);
}